

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O1

void __thiscall
BezierCurve::Define(BezierCurve *this,positionTy *_start,positionTy *_mid,positionTy *_end)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ptTy pVar3;
  long lVar4;
  BezierCurve *pBVar5;
  positionTy *ppVar6;
  
  pBVar5 = this;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pBVar5->start)._lat = _start->_lat;
    _start = (positionTy *)&_start->_lon;
    pBVar5 = (BezierCurve *)&(pBVar5->start)._lon;
  }
  uVar1 = _mid->_lat;
  uVar2 = _mid->_lon;
  pVar3.y._0_4_ = (int)uVar1;
  pVar3.x = (double)uVar2;
  pVar3.y._4_4_ = (int)((ulong)uVar1 >> 0x20);
  this->ptCtrl = pVar3;
  ppVar6 = &this->end;
  for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
    ppVar6->_lat = _end->_lat;
    _end = (positionTy *)&_end->_lon;
    ppVar6 = (positionTy *)&ppVar6->_lon;
  }
  ConvertToMeter(this);
  return;
}

Assistant:

void BezierCurve::Define (const positionTy& _start,
                          const positionTy& _mid,
                          const positionTy& _end)
{
    // init
    start   = _start;
    ptCtrl  = _mid;
    end     = _end;
    
#ifdef DEBUG
    if (gSelAcCalc)
        LOG_MSG(logDEBUG, "Quadratic Bezier defined:\n%s",
                dbgTxt().c_str());
#endif

    // Convert all coordinates to meter
    ConvertToMeter();
}